

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::TooManyProperties(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                    *this,SizeType actualCount,SizeType expectedCount)

{
  Data local_28;
  Data local_18;
  
  local_28._4_1_ = '\0';
  local_28._5_1_ = '\0';
  local_28._6_1_ = '\0';
  local_28._7_1_ = '\0';
  local_28._0_4_ = expectedCount;
  local_18._4_1_ = '\0';
  local_18._5_1_ = '\0';
  local_18._6_1_ = '\0';
  local_18._7_1_ = '\0';
  local_18._0_4_ = actualCount;
  local_18.s.str = (Ch *)((ulong)(-1 < (int)actualCount) << 0x35 | 0x1d6000000000000);
  local_28.s.str = (Ch *)((ulong)(-1 < (int)expectedCount) << 0x35 | 0x1d6000000000000);
  AddNumberError(this,kValidateErrorMaxProperties,(ValueType *)&local_18.s,(SValue *)&local_28.s,
                 (_func_ValueType_ptr *)0x0);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_28.s);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return;
}

Assistant:

void TooManyProperties(SizeType actualCount, SizeType expectedCount) {
        AddNumberError(kValidateErrorMaxProperties,
            ValueType(actualCount).Move(), SValue(expectedCount).Move());
    }